

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O2

void __thiscall cmXMLParser::StartElement(cmXMLParser *this,string *name,char **param_2)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Start element: ");
  poVar1 = std::operator<<(poVar1,(string *)name);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void cmXMLParser::StartElement(const std::string& name, const char** /*atts*/)
{
  std::cout << "Start element: " << name << std::endl;
}